

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void r4k_helper_tlbr_mipsel(CPUMIPSState_conflict2 *env)

{
  uint *puVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = env->CP0_Config5;
  uVar5 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  uVar4 = env->tlb->nb_tlb;
  bVar7 = (uVar6 >> 0x11 & 1) != 0;
  if (bVar7) {
    uVar5 = env->CP0_MemoryMapID;
  }
  puVar1 = (uint *)((long)&env->tlb->mmu +
                   ((ulong)(env->CP0_Index & 0x7fffffff) % (ulong)uVar4) * 0x28);
  if (bVar7) {
    uVar3 = puVar1[3];
  }
  else {
    uVar3 = (uint)(ushort)puVar1[2];
  }
  if (uVar5 != uVar3) {
    cpu_mips_tlb_flush_mipsel(env);
    uVar4 = env->tlb->nb_tlb;
  }
  r4k_mips_tlb_flush_extra(env,uVar4);
  if ((short)puVar1[4] < 0) {
    env->CP0_EntryHi = 0x400;
    env->CP0_PageMask = 0;
    env->CP0_EntryLo0 = 0;
    env->CP0_EntryLo1 = 0;
  }
  else {
    uVar4 = *puVar1;
    if ((uVar6 >> 0x11 & 1) == 0) {
      uVar4 = uVar4 | (ushort)puVar1[2];
    }
    env->CP0_EntryHi = uVar4;
    env->CP0_MemoryMapID = puVar1[3];
    env->CP0_PageMask = puVar1[1];
    uVar2 = (ushort)puVar1[4];
    uVar6 = (uint)uVar2;
    env->CP0_EntryLo0 =
         *(ulong *)(puVar1 + 6) >> 4 & 0xfffffff00000000 | *(ulong *)(puVar1 + 6) >> 6 & 0x3fffffc0
         | (ulong)(((uVar6 & 0x800) << 0x13 |
                   (uVar6 & 0x2000) << 0x12 | uVar2 >> 7 & 4 | uVar2 >> 6 & 2 | uVar6 & 1) +
                  (uVar6 & 0xe) * 4);
    uVar2 = (ushort)puVar1[4];
    env->CP0_EntryLo1 =
         *(ulong *)(puVar1 + 8) >> 4 & 0xfffffff00000000 | *(ulong *)(puVar1 + 8) >> 6 & 0x3fffffc0
         | (ulong)(uVar2 >> 1 & 0x38 |
                  (uVar2 & 0x1000) << 0x12 |
                  (uVar2 & 0x4000) << 0x11 | uVar2 >> 8 & 4 | uVar2 >> 7 & 2 | uVar2 & 1);
  }
  return;
}

Assistant:

void r4k_helper_tlbr(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    r4k_tlb_t *tlb;
    int idx;

    MMID = mi ? MMID : (uint32_t) ASID;
    idx = (env->CP0_Index & ~0x80000000) % env->tlb->nb_tlb;
    tlb = &env->tlb->mmu.r4k.tlb[idx];

    tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
    /* If this will change the current ASID/MMID, flush qemu's TLB.  */
    if (MMID != tlb_mmid) {
        cpu_mips_tlb_flush(env);
    }

    r4k_mips_tlb_flush_extra(env, env->tlb->nb_tlb);

    if (tlb->EHINV) {
        env->CP0_EntryHi = 1 << CP0EnHi_EHINV;
        env->CP0_PageMask = 0;
        env->CP0_EntryLo0 = 0;
        env->CP0_EntryLo1 = 0;
    } else {
        env->CP0_EntryHi = mi ? tlb->VPN : tlb->VPN | tlb->ASID;
        env->CP0_MemoryMapID = tlb->MMID;
        env->CP0_PageMask = tlb->PageMask;
        env->CP0_EntryLo0 = tlb->G | (tlb->V0 << 1) | (tlb->D0 << 2) |
                        ((uint64_t)tlb->RI0 << CP0EnLo_RI) |
                        ((uint64_t)tlb->XI0 << CP0EnLo_XI) | (tlb->C0 << 3) |
                        get_entrylo_pfn_from_tlb(tlb->PFN[0] >> 12);
        env->CP0_EntryLo1 = tlb->G | (tlb->V1 << 1) | (tlb->D1 << 2) |
                        ((uint64_t)tlb->RI1 << CP0EnLo_RI) |
                        ((uint64_t)tlb->XI1 << CP0EnLo_XI) | (tlb->C1 << 3) |
                        get_entrylo_pfn_from_tlb(tlb->PFN[1] >> 12);
    }
}